

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.h
# Opt level: O2

void FileUtil::output_latent_factors
               (string *output_file,value_type_conflict1 *data,int obj_num,int dim)

{
  ostream *poVar1;
  double *pdVar2;
  value_type_conflict1 *pvVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  ofstream fout;
  
  std::ofstream::ofstream((string *)&fout);
  std::ofstream::open((string *)&fout,(_Ios_Openmode)output_file);
  uVar5 = 0;
  pvVar3 = data;
  while( true ) {
    pdVar2 = pvVar3;
    uVar4 = (ulong)(~((int)(dim - 1U) >> 0x1f) & dim - 1U);
    if (uVar5 == (uint)(~(obj_num >> 0x1f) & obj_num)) break;
    while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
      poVar1 = std::ostream::_M_insert<double>(*pdVar2);
      std::operator<<(poVar1,",");
      pdVar2 = pdVar2 + obj_num;
    }
    poVar1 = std::ostream::_M_insert<double>(data[(long)(dim * obj_num) + uVar5]);
    std::endl<char,std::char_traits<char>>(poVar1);
    uVar5 = uVar5 + 1;
    pvVar3 = pvVar3 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&fout);
  return;
}

Assistant:

void output_latent_factors(const string output_file, const value_type *data, const int obj_num, const int dim){
        // input is column-wise but output will be row-wise
        ofstream fout;
        fout.open(output_file);

        for (int obj_id = 0; obj_id < obj_num; obj_id++) {
            for (int d = 0; d < dim - 1; d++) {
                fout << data[d * obj_num + obj_id] << ",";
            }
            fout << data[dim * obj_num + obj_id] << endl;
        }

        fout.close();
    }